

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O0

int stdout_close(int handle)

{
  size_t sVar1;
  int in_EDI;
  int status;
  int local_8;
  
  local_8 = 0;
  sVar1 = fwrite(memTable[in_EDI].memaddr,1,memTable[in_EDI].fitsfilesize,_stdout);
  if (sVar1 != memTable[in_EDI].fitsfilesize) {
    ffpmsg((char *)0x13b093);
    local_8 = 0x6a;
  }
  free(memTable[in_EDI].memaddr);
  memTable[in_EDI].memaddrptr = (char **)0x0;
  memTable[in_EDI].memaddr = (char *)0x0;
  return local_8;
}

Assistant:

int stdout_close(int handle)
/*
  copy the memory file to stdout, then free the memory
*/
{
    int status = 0;

    /* copy from memory to standard out.  explicit LONGLONG->size_t cast */
    if(fwrite(memTable[handle].memaddr, 1,
              ((size_t) memTable[handle].fitsfilesize), stdout) !=
              (size_t) memTable[handle].fitsfilesize )
    {
                ffpmsg("failed to copy memory file to stdout (stdout_close)");
                status = WRITE_ERROR;
    }

    free( memTable[handle].memaddr );   /* free the memory */
    memTable[handle].memaddrptr = 0;
    memTable[handle].memaddr = 0;
    return(status);
}